

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  byte bVar16;
  ulong *puVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  size_t i;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar31 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM19 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2608;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  puVar17 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  auVar47._16_4_ = fVar1;
  auVar47._20_4_ = fVar1;
  auVar47._24_4_ = fVar1;
  auVar47._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar48._4_4_ = fVar2;
  auVar48._0_4_ = fVar2;
  auVar48._8_4_ = fVar2;
  auVar48._12_4_ = fVar2;
  auVar48._16_4_ = fVar2;
  auVar48._20_4_ = fVar2;
  auVar48._24_4_ = fVar2;
  auVar48._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar49._4_4_ = fVar3;
  auVar49._0_4_ = fVar3;
  auVar49._8_4_ = fVar3;
  auVar49._12_4_ = fVar3;
  auVar49._16_4_ = fVar3;
  auVar49._20_4_ = fVar3;
  auVar49._24_4_ = fVar3;
  auVar49._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar32 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar58 = ZEXT3264(auVar32);
  auVar50._8_4_ = 0x80000000;
  auVar50._0_8_ = 0x8000000080000000;
  auVar50._12_4_ = 0x80000000;
  auVar50._16_4_ = 0x80000000;
  auVar50._20_4_ = 0x80000000;
  auVar50._24_4_ = 0x80000000;
  auVar50._28_4_ = 0x80000000;
  auVar51._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar51._8_4_ = -fVar1;
  auVar51._12_4_ = -fVar1;
  auVar51._16_4_ = -fVar1;
  auVar51._20_4_ = -fVar1;
  auVar51._24_4_ = -fVar1;
  auVar51._28_4_ = -fVar1;
  auVar52._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar52._8_4_ = -fVar2;
  auVar52._12_4_ = -fVar2;
  auVar52._16_4_ = -fVar2;
  auVar52._20_4_ = -fVar2;
  auVar52._24_4_ = -fVar2;
  auVar52._28_4_ = -fVar2;
  auVar53._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar53._8_4_ = -fVar3;
  auVar53._12_4_ = -fVar3;
  auVar53._16_4_ = -fVar3;
  auVar53._20_4_ = -fVar3;
  auVar53._24_4_ = -fVar3;
  auVar53._28_4_ = -fVar3;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar54._4_4_ = iVar4;
  auVar54._0_4_ = iVar4;
  auVar54._8_4_ = iVar4;
  auVar54._12_4_ = iVar4;
  auVar54._16_4_ = iVar4;
  auVar54._20_4_ = iVar4;
  auVar54._24_4_ = iVar4;
  auVar54._28_4_ = iVar4;
  auVar32 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar55._8_4_ = 0xfffffff8;
  auVar55._0_8_ = 0xfffffff8fffffff8;
  auVar55._12_4_ = 0xfffffff8;
  auVar55._16_4_ = 0xfffffff8;
  auVar55._20_4_ = 0xfffffff8;
  auVar55._24_4_ = 0xfffffff8;
  auVar55._28_4_ = 0xfffffff8;
  auVar57._8_4_ = 0x7fffffff;
  auVar57._0_8_ = 0x7fffffff7fffffff;
  auVar57._12_4_ = 0x7fffffff;
  auVar57._16_4_ = 0x7fffffff;
  auVar57._20_4_ = 0x7fffffff;
  auVar57._24_4_ = 0x7fffffff;
  auVar57._28_4_ = 0x7fffffff;
  auVar30 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
LAB_01da9590:
  do {
    if (puVar17 == &local_23a0) {
      return;
    }
    bVar29 = puVar17 < &DAT_00000010;
    puVar17 = puVar17 + -2;
    vucomiss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  } while (bVar29 && puVar17 != (ulong *)0x0);
  uVar26 = *puVar17;
LAB_01da95b1:
  do {
    if ((uVar26 & 8) != 0) break;
    auVar33 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar19),auVar51,auVar47);
    auVar34 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar20),auVar52,auVar48);
    auVar33 = vpmaxsd_avx512vl(auVar33,auVar34);
    auVar34 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar21),auVar53,auVar49);
    auVar34 = vpmaxsd_avx512vl(auVar34,auVar54);
    auVar33 = vpmaxsd_avx512vl(auVar33,auVar34);
    auVar34 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar19 ^ 0x20)),auVar51,auVar47);
    auVar35 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar20 ^ 0x20)),auVar52,auVar48);
    auVar34 = vpminsd_avx512vl(auVar34,auVar35);
    auVar35 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar21 ^ 0x20)),auVar53,auVar49);
    auVar35 = vpminsd_avx512vl(auVar35,auVar58._0_32_);
    auVar34 = vpminsd_avx512vl(auVar34,auVar35);
    uVar27 = vpcmpd_avx512vl(auVar33,auVar34,2);
    bVar22 = (byte)uVar27;
    if (bVar22 == 0) goto LAB_01da9590;
    auVar34 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar26 & 0xfffffffffffffff0));
    auVar35 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar26 & 0xfffffffffffffff0))[1]);
    auVar36 = vmovdqa64_avx512vl(auVar32);
    auVar36 = vpternlogd_avx512vl(auVar36,auVar33,auVar55,0xf8);
    auVar37 = vpcompressd_avx512vl(auVar36);
    auVar42._0_4_ = (uint)(bVar22 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar22 & 1) * auVar36._0_4_;
    bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar42._4_4_ = (uint)bVar29 * auVar37._4_4_ | (uint)!bVar29 * auVar36._4_4_;
    bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar42._8_4_ = (uint)bVar29 * auVar37._8_4_ | (uint)!bVar29 * auVar36._8_4_;
    bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar42._12_4_ = (uint)bVar29 * auVar37._12_4_ | (uint)!bVar29 * auVar36._12_4_;
    bVar29 = (bool)((byte)(uVar27 >> 4) & 1);
    auVar42._16_4_ = (uint)bVar29 * auVar37._16_4_ | (uint)!bVar29 * auVar36._16_4_;
    bVar29 = (bool)((byte)(uVar27 >> 5) & 1);
    auVar42._20_4_ = (uint)bVar29 * auVar37._20_4_ | (uint)!bVar29 * auVar36._20_4_;
    bVar29 = (bool)((byte)(uVar27 >> 6) & 1);
    auVar42._24_4_ = (uint)bVar29 * auVar37._24_4_ | (uint)!bVar29 * auVar36._24_4_;
    bVar29 = SUB81(uVar27 >> 7,0);
    auVar42._28_4_ = (uint)bVar29 * auVar37._28_4_ | (uint)!bVar29 * auVar36._28_4_;
    auVar36 = vmovdqa64_avx512vl(auVar34);
    auVar36 = vpermt2q_avx512vl(auVar36,auVar42,auVar35);
    uVar26 = auVar36._0_8_;
    bVar22 = bVar22 - 1 & bVar22;
    if (bVar22 != 0) {
      auVar36 = vpshufd_avx512vl(auVar42,0x55);
      auVar37 = vmovdqa64_avx512vl(auVar34);
      vpermt2q_avx512vl(auVar37,auVar36,auVar35);
      auVar37 = vpminsd_avx512vl(auVar42,auVar36);
      auVar36 = vpmaxsd_avx512vl(auVar42,auVar36);
      bVar22 = bVar22 - 1 & bVar22;
      if (bVar22 == 0) {
        auVar37 = vpermi2q_avx512vl(auVar37,auVar34,auVar35);
        uVar26 = auVar37._0_8_;
        auVar34 = vpermt2q_avx512vl(auVar34,auVar36,auVar35);
        *puVar17 = auVar34._0_8_;
        lVar18 = 8;
        lStack_2608 = 0x10;
      }
      else {
        auVar38 = vpshufd_avx512vl(auVar42,0xaa);
        auVar39 = vmovdqa64_avx512vl(auVar34);
        vpermt2q_avx512vl(auVar39,auVar38,auVar35);
        auVar39 = vpminsd_avx512vl(auVar37,auVar38);
        auVar37 = vpmaxsd_avx512vl(auVar37,auVar38);
        auVar38 = vpminsd_avx512vl(auVar36,auVar37);
        auVar37 = vpmaxsd_avx512vl(auVar36,auVar37);
        bVar22 = bVar22 - 1 & bVar22;
        if (bVar22 == 0) {
          auVar36 = vpermi2q_avx512vl(auVar39,auVar34,auVar35);
          uVar26 = auVar36._0_8_;
          auVar36 = vmovdqa64_avx512vl(auVar34);
          auVar36 = vpermt2q_avx512vl(auVar36,auVar37,auVar35);
          *puVar17 = auVar36._0_8_;
          auVar36 = vpermd_avx512vl(auVar37,auVar33);
          *(int *)(puVar17 + 1) = auVar36._0_4_;
          auVar34 = vpermt2q_avx512vl(auVar34,auVar38,auVar35);
          puVar17[2] = auVar34._0_8_;
          auVar36 = vmovdqa64_avx512vl(auVar38);
          lStack_2608 = 0x18;
          lVar18 = lStack_2608;
          lStack_2608 = 0x20;
        }
        else {
          auVar36 = vpshufd_avx512vl(auVar42,0xff);
          auVar40 = vmovdqa64_avx512vl(auVar34);
          vpermt2q_avx512vl(auVar40,auVar36,auVar35);
          auVar40 = vpminsd_avx512vl(auVar39,auVar36);
          auVar39 = vpmaxsd_avx512vl(auVar39,auVar36);
          auVar36 = vpminsd_avx512vl(auVar38,auVar39);
          auVar38 = vpmaxsd_avx512vl(auVar38,auVar39);
          auVar39 = vpminsd_avx512vl(auVar37,auVar38);
          auVar37 = vpmaxsd_avx512vl(auVar37,auVar38);
          bVar22 = bVar22 - 1 & bVar22;
          if (bVar22 != 0) {
            auVar41 = valignd_avx512vl(auVar42,auVar42,3);
            auVar31 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar38 = vpmovsxbd_avx2(ZEXT816(0x303020108));
            auVar40 = vpermt2d_avx512vl(ZEXT1632(auVar31),auVar38,auVar40);
            auVar38 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar36 = vpermt2d_avx512vl(auVar40,auVar38,auVar36);
            auVar38 = vpermt2d_avx512vl(auVar36,auVar38,auVar39);
            auVar36 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar36 = vpermt2d_avx512vl(auVar38,auVar36,auVar37);
            auVar59 = ZEXT3264(auVar36);
            bVar23 = bVar22;
            do {
              auVar36 = vmovdqa64_avx512vl(auVar59._0_32_);
              auVar43._8_4_ = 1;
              auVar43._0_8_ = 0x100000001;
              auVar43._12_4_ = 1;
              auVar43._16_4_ = 1;
              auVar43._20_4_ = 1;
              auVar43._24_4_ = 1;
              auVar43._28_4_ = 1;
              auVar37 = vpermd_avx512vl(auVar43,auVar41);
              auVar41 = valignd_avx512vl(auVar41,auVar41,1);
              auVar38 = vmovdqa64_avx512vl(auVar34);
              vpermt2q_avx512vl(auVar38,auVar41,auVar35);
              bVar23 = bVar23 - 1 & bVar23;
              uVar15 = vpcmpd_avx512vl(auVar37,auVar36,5);
              auVar37 = vpmaxsd_avx512vl(auVar37,auVar36);
              bVar16 = (byte)uVar15 << 1;
              auVar36 = valignd_avx512vl(auVar36,auVar36,7);
              bVar29 = (bool)((byte)uVar15 & 1);
              bVar7 = (bool)(bVar16 >> 2 & 1);
              bVar8 = (bool)(bVar16 >> 3 & 1);
              bVar9 = (bool)(bVar16 >> 4 & 1);
              bVar10 = (bool)(bVar16 >> 5 & 1);
              bVar11 = (bool)(bVar16 >> 6 & 1);
              auVar59 = ZEXT3264(CONCAT428((uint)(bVar16 >> 7) * auVar36._28_4_ |
                                           (uint)!(bool)(bVar16 >> 7) * auVar37._28_4_,
                                           CONCAT424((uint)bVar11 * auVar36._24_4_ |
                                                     (uint)!bVar11 * auVar37._24_4_,
                                                     CONCAT420((uint)bVar10 * auVar36._20_4_ |
                                                               (uint)!bVar10 * auVar37._20_4_,
                                                               CONCAT416((uint)bVar9 *
                                                                         auVar36._16_4_ |
                                                                         (uint)!bVar9 *
                                                                         auVar37._16_4_,
                                                                         CONCAT412((uint)bVar8 *
                                                                                   auVar36._12_4_ |
                                                                                   (uint)!bVar8 *
                                                                                   auVar37._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar7 * auVar36._8_4_ |
                                                  (uint)!bVar7 * auVar37._8_4_,
                                                  CONCAT44((uint)bVar29 * auVar36._4_4_ |
                                                           (uint)!bVar29 * auVar37._4_4_,
                                                           auVar37._0_4_))))))));
            } while (bVar23 != 0);
            lVar18 = (ulong)(uint)POPCOUNT((uint)bVar22) + 3;
            while( true ) {
              auVar36 = vmovdqa64_avx512vl(auVar34);
              auVar37 = auVar59._0_32_;
              auVar36 = vpermt2q_avx512vl(auVar36,auVar37,auVar35);
              uVar26 = auVar36._0_8_;
              bVar29 = lVar18 == 0;
              lVar18 = lVar18 + -1;
              if (bVar29) break;
              *puVar17 = uVar26;
              auVar36 = vpermd_avx512vl(auVar37,auVar33);
              *(int *)(puVar17 + 1) = auVar36._0_4_;
              auVar36 = valignd_avx512vl(auVar37,auVar37,1);
              auVar59 = ZEXT3264(auVar36);
              puVar17 = puVar17 + 2;
            }
            goto LAB_01da95b1;
          }
          auVar38 = vpermi2q_avx512vl(auVar40,auVar34,auVar35);
          uVar26 = auVar38._0_8_;
          auVar38 = vmovdqa64_avx512vl(auVar34);
          auVar38 = vpermt2q_avx512vl(auVar38,auVar37,auVar35);
          *puVar17 = auVar38._0_8_;
          auVar37 = vpermd_avx512vl(auVar37,auVar33);
          *(int *)(puVar17 + 1) = auVar37._0_4_;
          auVar37 = vmovdqa64_avx512vl(auVar34);
          auVar37 = vpermt2q_avx512vl(auVar37,auVar39,auVar35);
          puVar17[2] = auVar37._0_8_;
          auVar37 = vpermd_avx512vl(auVar39,auVar33);
          *(int *)(puVar17 + 3) = auVar37._0_4_;
          auVar34 = vpermt2q_avx512vl(auVar34,auVar36,auVar35);
          puVar17[4] = auVar34._0_8_;
          lVar18 = 0x28;
          lStack_2608 = 0x30;
        }
      }
      auVar33 = vpermd_avx512vl(auVar36,auVar33);
      *(int *)((long)puVar17 + lVar18) = auVar33._0_4_;
      puVar17 = (ulong *)((long)puVar17 + lStack_2608);
    }
  } while( true );
  uVar27 = uVar26 & 0xfffffffffffffff0;
  for (lVar18 = 0; lVar18 != (ulong)((uint)uVar26 & 0xf) - 8; lVar18 = lVar18 + 1) {
    lVar25 = lVar18 * 0xe0;
    auVar33 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x34 + lVar25));
    auVar34 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x30 + lVar25));
    local_25a0 = vmovdqa64_avx512vl(auVar34);
    local_25c0 = vmovdqa64_avx512vl(auVar33);
    auVar34 = vinsertf32x4_avx512vl
                        (ZEXT1632(*(undefined1 (*) [16])(uVar27 + lVar25)),
                         *(undefined1 (*) [16])(uVar27 + 0x30 + lVar25),1);
    auVar35 = vinsertf32x4_avx512vl
                        (ZEXT1632(*(undefined1 (*) [16])(uVar27 + 0x10 + lVar25)),
                         *(undefined1 (*) [16])(uVar27 + 0x38 + lVar25),1);
    auVar36 = vinsertf32x4_avx512vl
                        (ZEXT1632(*(undefined1 (*) [16])(uVar27 + 0x20 + lVar25)),
                         *(undefined1 (*) [16])(uVar27 + 0x40 + lVar25),1);
    auVar33 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0xc + lVar25));
    auVar37 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x10 + lVar25));
    auVar38 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x14 + lVar25));
    auVar39 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x24 + lVar25));
    auVar40 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x28 + lVar25));
    auVar41 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x2c + lVar25));
    auVar42 = vsubps_avx512vl(auVar34,auVar33);
    auVar37 = vsubps_avx512vl(auVar35,auVar37);
    auVar38 = vsubps_avx512vl(auVar36,auVar38);
    auVar39 = vsubps_avx512vl(auVar39,auVar34);
    auVar40 = vsubps_avx512vl(auVar40,auVar35);
    auVar41 = vsubps_avx512vl(auVar41,auVar36);
    auVar33 = vmulps_avx512vl(auVar37,auVar41);
    local_2500 = vfmsub231ps_avx512vl(auVar33,auVar40,auVar38);
    auVar33 = vmulps_avx512vl(auVar38,auVar39);
    local_24e0 = vfmsub231ps_avx512vl(auVar33,auVar41,auVar42);
    auVar43 = vmulps_avx512vl(auVar42,auVar40);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar56._4_4_ = uVar5;
    auVar56._0_4_ = uVar5;
    auVar56._8_4_ = uVar5;
    auVar56._12_4_ = uVar5;
    auVar56._16_4_ = uVar5;
    auVar56._20_4_ = uVar5;
    auVar56._24_4_ = uVar5;
    auVar56._28_4_ = uVar5;
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar46._4_4_ = uVar5;
    auVar46._0_4_ = uVar5;
    auVar46._8_4_ = uVar5;
    auVar46._12_4_ = uVar5;
    auVar46._16_4_ = uVar5;
    auVar46._20_4_ = uVar5;
    auVar46._24_4_ = uVar5;
    auVar46._28_4_ = uVar5;
    uVar5 = *(undefined4 *)(ray + k * 4);
    auVar33._4_4_ = uVar5;
    auVar33._0_4_ = uVar5;
    auVar33._8_4_ = uVar5;
    auVar33._12_4_ = uVar5;
    auVar33._16_4_ = uVar5;
    auVar33._20_4_ = uVar5;
    auVar33._24_4_ = uVar5;
    auVar33._28_4_ = uVar5;
    auVar33 = vsubps_avx512vl(auVar34,auVar33);
    local_24c0 = vfmsub231ps_avx512vl(auVar43,auVar39,auVar37);
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar34._4_4_ = uVar5;
    auVar34._0_4_ = uVar5;
    auVar34._8_4_ = uVar5;
    auVar34._12_4_ = uVar5;
    auVar34._16_4_ = uVar5;
    auVar34._20_4_ = uVar5;
    auVar34._24_4_ = uVar5;
    auVar34._28_4_ = uVar5;
    auVar34 = vsubps_avx512vl(auVar35,auVar34);
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar35._4_4_ = uVar5;
    auVar35._0_4_ = uVar5;
    auVar35._8_4_ = uVar5;
    auVar35._12_4_ = uVar5;
    auVar35._16_4_ = uVar5;
    auVar35._20_4_ = uVar5;
    auVar35._24_4_ = uVar5;
    auVar35._28_4_ = uVar5;
    auVar35 = vsubps_avx512vl(auVar36,auVar35);
    auVar36 = vmulps_avx512vl(auVar56,auVar35);
    auVar36 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar46);
    auVar43 = vmulps_avx512vl(auVar46,auVar33);
    auVar43 = vfmsub231ps_avx512vl(auVar43,auVar35,auVar44);
    auVar45 = vmulps_avx512vl(auVar44,auVar34);
    auVar45 = vfmsub231ps_avx512vl(auVar45,auVar33,auVar56);
    auVar46 = vmulps_avx512vl(local_24c0,auVar46);
    auVar46 = vfmadd231ps_avx512vl(auVar46,local_24e0,auVar56);
    local_2520 = vfmadd231ps_avx512vl(auVar46,local_2500,auVar44);
    vandps_avx512vl(local_2520,auVar57);
    vandps_avx512vl(local_2520,auVar50);
    auVar41 = vmulps_avx512vl(auVar41,auVar45);
    auVar40 = vfmadd231ps_avx512vl(auVar41,auVar43,auVar40);
    auVar39 = vfmadd231ps_avx512vl(auVar40,auVar36,auVar39);
    local_2580 = vxorps_avx512vl(local_2520,auVar39);
    auVar38 = vmulps_avx512vl(auVar38,auVar45);
    auVar37 = vfmadd231ps_avx512vl(auVar38,auVar37,auVar43);
    auVar36 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar36);
    local_2560 = vxorps_avx512vl(local_2520,auVar36);
    uVar15 = vcmpps_avx512vl(local_2580,ZEXT1632(auVar30),5);
    uVar12 = vcmpps_avx512vl(local_2560,ZEXT1632(auVar30),5);
    uVar13 = vcmpps_avx512vl(local_2520,ZEXT1632(auVar30),4);
    auVar36 = vaddps_avx512vl(local_2580,local_2560);
    uVar14 = vcmpps_avx512vl(auVar36,local_2520,2);
    local_24a0 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
    if (local_24a0 != 0) {
      auVar35 = vmulps_avx512vl(local_24c0,auVar35);
      auVar34 = vfmadd213ps_avx512vl(auVar34,local_24e0,auVar35);
      auVar33 = vfmadd213ps_avx512vl(auVar33,local_2500,auVar34);
      local_2540 = vxorps_avx512vl(local_2520,auVar33);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar36._4_4_ = uVar5;
      auVar36._0_4_ = uVar5;
      auVar36._8_4_ = uVar5;
      auVar36._12_4_ = uVar5;
      auVar36._16_4_ = uVar5;
      auVar36._20_4_ = uVar5;
      auVar36._24_4_ = uVar5;
      auVar36._28_4_ = uVar5;
      auVar33 = vmulps_avx512vl(local_2520,auVar36);
      uVar15 = vcmpps_avx512vl(auVar33,local_2540,1);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar37._4_4_ = uVar5;
      auVar37._0_4_ = uVar5;
      auVar37._8_4_ = uVar5;
      auVar37._12_4_ = uVar5;
      auVar37._16_4_ = uVar5;
      auVar37._20_4_ = uVar5;
      auVar37._24_4_ = uVar5;
      auVar37._28_4_ = uVar5;
      auVar33 = vmulps_avx512vl(local_2520,auVar37);
      uVar12 = vcmpps_avx512vl(local_2540,auVar33,2);
      local_24a0 = (byte)uVar15 & (byte)uVar12 & local_24a0;
      if (local_24a0 != 0) {
        local_23c0 = 0xf0;
        auVar33 = vrcp14ps_avx512vl(local_2520);
        auVar39._8_4_ = 0x3f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._12_4_ = 0x3f800000;
        auVar39._16_4_ = 0x3f800000;
        auVar39._20_4_ = 0x3f800000;
        auVar39._24_4_ = 0x3f800000;
        auVar39._28_4_ = 0x3f800000;
        auVar34 = vfnmadd213ps_avx512vl(local_2520,auVar33,auVar39);
        auVar34 = vfmadd132ps_avx512vl(auVar34,auVar33,auVar33);
        local_2440 = vmulps_avx512vl(auVar34,local_2540);
        auVar33 = vmulps_avx512vl(auVar34,local_2580);
        auVar33 = vminps_avx(auVar33,auVar39);
        auVar34 = vmulps_avx512vl(auVar34,local_2560);
        auVar34 = vminps_avx(auVar34,auVar39);
        auVar35 = vsubps_avx(auVar39,auVar33);
        auVar36 = vsubps_avx(auVar39,auVar34);
        local_2460 = vblendps_avx(auVar34,auVar35,0xf0);
        local_2480 = vblendps_avx(auVar33,auVar36,0xf0);
        local_2420 = vmulps_avx512vl(local_2500,_DAT_01fbac00);
        local_2400 = vmulps_avx512vl(local_24e0,_DAT_01fbac00);
        local_23e0 = vmulps_avx512vl(local_24c0,_DAT_01fbac00);
        auVar40._8_4_ = 0x7f800000;
        auVar40._0_8_ = 0x7f8000007f800000;
        auVar40._12_4_ = 0x7f800000;
        auVar40._16_4_ = 0x7f800000;
        auVar40._20_4_ = 0x7f800000;
        auVar40._24_4_ = 0x7f800000;
        auVar40._28_4_ = 0x7f800000;
        auVar33 = vblendmps_avx512vl(auVar40,local_2440);
        auVar38._0_4_ =
             (uint)(local_24a0 & 1) * auVar33._0_4_ |
             (uint)!(bool)(local_24a0 & 1) * local_23e0._0_4_;
        bVar29 = (bool)(local_24a0 >> 1 & 1);
        auVar38._4_4_ = (uint)bVar29 * auVar33._4_4_ | (uint)!bVar29 * local_23e0._4_4_;
        bVar29 = (bool)(local_24a0 >> 2 & 1);
        auVar38._8_4_ = (uint)bVar29 * auVar33._8_4_ | (uint)!bVar29 * local_23e0._8_4_;
        bVar29 = (bool)(local_24a0 >> 3 & 1);
        auVar38._12_4_ = (uint)bVar29 * auVar33._12_4_ | (uint)!bVar29 * local_23e0._12_4_;
        bVar29 = (bool)(local_24a0 >> 4 & 1);
        auVar38._16_4_ = (uint)bVar29 * auVar33._16_4_ | (uint)!bVar29 * local_23e0._16_4_;
        bVar29 = (bool)(local_24a0 >> 5 & 1);
        auVar38._20_4_ = (uint)bVar29 * auVar33._20_4_ | (uint)!bVar29 * local_23e0._20_4_;
        bVar29 = (bool)(local_24a0 >> 6 & 1);
        auVar38._24_4_ = (uint)bVar29 * auVar33._24_4_ | (uint)!bVar29 * local_23e0._24_4_;
        auVar38._28_4_ =
             (uint)(local_24a0 >> 7) * auVar33._28_4_ |
             (uint)!(bool)(local_24a0 >> 7) * local_23e0._28_4_;
        auVar33 = vshufps_avx(auVar38,auVar38,0xb1);
        auVar33 = vminps_avx(auVar38,auVar33);
        auVar34 = vshufpd_avx(auVar33,auVar33,5);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar34 = vpermpd_avx2(auVar33,0x4e);
        auVar33 = vminps_avx(auVar33,auVar34);
        uVar15 = vcmpps_avx512vl(auVar38,auVar33,0);
        bVar22 = local_24a0;
        if (((byte)uVar15 & local_24a0) != 0) {
          bVar22 = (byte)uVar15 & local_24a0;
        }
        uVar28 = 0;
        for (uVar24 = (uint)bVar22; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
          uVar28 = uVar28 + 1;
        }
        while( true ) {
          uVar24 = *(uint *)(local_25a0 + (ulong)(uVar28 & 0xff) * 4);
          if ((((context->scene->geometries).items[uVar24].ptr)->mask &
              *(uint *)(ray + k * 4 + 0x90)) != 0) break;
          bVar22 = (byte)(1 << (uVar28 & 0x1f));
          if ((~bVar22 & local_24a0) == 0) goto LAB_01da9b21;
          local_24a0 = ~bVar22 & local_24a0;
          auVar33 = vblendmps_avx512vl(auVar40,local_2440);
          auVar41._0_4_ =
               (uint)(local_24a0 & 1) * auVar33._0_4_ |
               (uint)!(bool)(local_24a0 & 1) * auVar38._0_4_;
          bVar29 = (bool)(local_24a0 >> 1 & 1);
          auVar41._4_4_ = (uint)bVar29 * auVar33._4_4_ | (uint)!bVar29 * auVar38._4_4_;
          bVar29 = (bool)(local_24a0 >> 2 & 1);
          auVar41._8_4_ = (uint)bVar29 * auVar33._8_4_ | (uint)!bVar29 * auVar38._8_4_;
          bVar29 = (bool)(local_24a0 >> 3 & 1);
          auVar41._12_4_ = (uint)bVar29 * auVar33._12_4_ | (uint)!bVar29 * auVar38._12_4_;
          bVar29 = (bool)(local_24a0 >> 4 & 1);
          auVar41._16_4_ = (uint)bVar29 * auVar33._16_4_ | (uint)!bVar29 * auVar38._16_4_;
          bVar29 = (bool)(local_24a0 >> 5 & 1);
          auVar41._20_4_ = (uint)bVar29 * auVar33._20_4_ | (uint)!bVar29 * auVar38._20_4_;
          bVar29 = (bool)(local_24a0 >> 6 & 1);
          auVar41._24_4_ = (uint)bVar29 * auVar33._24_4_ | (uint)!bVar29 * auVar38._24_4_;
          auVar41._28_4_ =
               (uint)(local_24a0 >> 7) * auVar33._28_4_ |
               (uint)!(bool)(local_24a0 >> 7) * auVar38._28_4_;
          auVar33 = vshufps_avx(auVar41,auVar41,0xb1);
          auVar33 = vminps_avx(auVar41,auVar33);
          auVar34 = vshufpd_avx(auVar33,auVar33,5);
          auVar33 = vminps_avx(auVar33,auVar34);
          auVar34 = vpermpd_avx2(auVar33,0x4e);
          auVar33 = vminps_avx(auVar33,auVar34);
          uVar15 = vcmpps_avx512vl(auVar41,auVar33,0);
          bVar23 = (byte)uVar15 & local_24a0;
          bVar22 = local_24a0;
          if (bVar23 != 0) {
            bVar22 = bVar23;
          }
          uVar28 = 0;
          for (uVar24 = (uint)bVar22; auVar38 = auVar41, (uVar24 & 1) == 0;
              uVar24 = uVar24 >> 1 | 0x80000000) {
            uVar28 = uVar28 + 1;
          }
        }
        uVar28 = (uVar28 & 0xff) << 2;
        uVar5 = *(undefined4 *)(local_2480 + uVar28);
        uVar6 = *(undefined4 *)(local_2460 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
        *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
        *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(local_25c0 + uVar28);
        *(uint *)(ray + k * 4 + 0x120) = uVar24;
        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
      }
    }
LAB_01da9b21:
  }
  auVar33 = vpbroadcastd_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar58 = ZEXT3264(auVar33);
  goto LAB_01da9590;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }